

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O2

BOOL __thiscall FuncInfo::IsBaseClassConstructor(FuncInfo *this)

{
  bool bVar1;
  
  bVar1 = Js::FunctionProxy::IsBaseClassConstructor(&this->byteCodeFunction->super_FunctionProxy);
  return (BOOL)bVar1;
}

Assistant:

BOOL FuncInfo::IsBaseClassConstructor() const
{
    return this->byteCodeFunction->IsBaseClassConstructor();
}